

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_tcp_ref(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uv_tcp_t h;
  uv_stream_t uStack_310;
  uv_loop_t *puStack_218;
  uv_stream_t uStack_208;
  uv_loop_t *puStack_110;
  uv_tcp_t local_100;
  
  puStack_110 = (uv_loop_t *)0x166dac;
  puVar2 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x166dbc;
  uv_tcp_init(puVar2,&local_100);
  puStack_110 = (uv_loop_t *)0x166dc4;
  uv_unref((uv_handle_t *)&local_100);
  puStack_110 = (uv_loop_t *)0x166dc9;
  puVar2 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x166dd3;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_110 = (uv_loop_t *)0x166ddb;
  do_close(&local_100);
  puStack_110 = (uv_loop_t *)0x166de0;
  puVar2 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x166df4;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_110 = (uv_loop_t *)0x166dfe;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_110 = (uv_loop_t *)0x166e03;
  puVar3 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x166e0b;
  iVar1 = uv_loop_close(puVar3);
  if (iVar1 == 0) {
    return 0;
  }
  puStack_110 = (uv_loop_t *)run_test_tcp_ref2;
  run_test_tcp_ref_cold_1();
  puStack_218 = (uv_loop_t *)0x166e2c;
  puStack_110 = puVar2;
  puVar2 = uv_default_loop();
  puStack_218 = (uv_loop_t *)0x166e3c;
  uv_tcp_init(puVar2,(uv_tcp_t *)&uStack_208);
  puStack_218 = (uv_loop_t *)0x166e50;
  uv_listen(&uStack_208,0x80,fail_cb);
  puStack_218 = (uv_loop_t *)0x166e58;
  uv_unref((uv_handle_t *)&uStack_208);
  puStack_218 = (uv_loop_t *)0x166e5d;
  puVar2 = uv_default_loop();
  puStack_218 = (uv_loop_t *)0x166e67;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_218 = (uv_loop_t *)0x166e6f;
  do_close(&uStack_208);
  puStack_218 = (uv_loop_t *)0x166e74;
  puVar2 = uv_default_loop();
  puStack_218 = (uv_loop_t *)0x166e88;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_218 = (uv_loop_t *)0x166e92;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_218 = (uv_loop_t *)0x166e97;
  puVar3 = uv_default_loop();
  puStack_218 = (uv_loop_t *)0x166e9f;
  iVar1 = uv_loop_close(puVar3);
  if (iVar1 == 0) {
    return 0;
  }
  puStack_218 = (uv_loop_t *)run_test_tcp_ref2b;
  run_test_tcp_ref2_cold_1();
  puStack_218 = puVar2;
  puVar2 = uv_default_loop();
  uv_tcp_init(puVar2,(uv_tcp_t *)&uStack_310);
  uv_listen(&uStack_310,0x80,fail_cb);
  uv_unref((uv_handle_t *)&uStack_310);
  uv_close((uv_handle_t *)&uStack_310,close_cb);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (close_cb_called == 1) {
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_ref2b_cold_1();
  }
  run_test_tcp_ref2b_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_ref) {
  uv_tcp_t h;
  uv_tcp_init(uv_default_loop(), &h);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}